

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O0

void __thiscall xray_re::way_link_io::operator()(way_link_io *this,way_link *link,xr_writer *w)

{
  xr_writer *w_local;
  way_link *link_local;
  way_link_io *this_local;
  
  xr_writer::w_u16(w,link->from);
  xr_writer::w_u16(w,link->to);
  xr_writer::w_float(w,link->weight);
  return;
}

Assistant:

void way_link_io::operator()(const way_link& link, xr_writer& w) const
{
	w.w_u16(link.from);
	w.w_u16(link.to);
	w.w_float(link.weight);
}